

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_test.cpp
# Opt level: O2

void flatbuffers::tests::JsonDefaultTest(string *tests_data_path)

{
  bool bVar1;
  Offset<flatbuffers::String> name;
  Offset<MyGame::Example::Monster> root;
  uint8_t *flatbuffer;
  char *pcVar2;
  long lVar3;
  string jsongen;
  MonsterBuilder color_monster;
  string schemafile;
  string include_test_path;
  char *include_directories [3];
  FlatBufferBuilder builder;
  Parser parser;
  
  schemafile._M_dataplus._M_p = (pointer)&schemafile.field_2;
  schemafile._M_string_length = 0;
  schemafile.field_2._M_local_buf[0] = '\0';
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&parser,
                 tests_data_path,"monster_test.fbs");
  bVar1 = LoadFile(parser.super_ParserState.prev_cursor_,false,&schemafile);
  TestEq<bool,bool>(bVar1,true,
                    "\'flatbuffers::LoadFile((tests_data_path + \"monster_test.fbs\").c_str(), false, &schemafile)\' != \'true\'"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/json_test.cpp"
                    ,0x15,"");
  std::__cxx11::string::~string((string *)&parser);
  IDLOptions::IDLOptions((IDLOptions *)&builder);
  Parser::Parser(&parser,(IDLOptions *)&builder);
  IDLOptions::~IDLOptions((IDLOptions *)&builder);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&builder,"include_test",(allocator<char> *)&jsongen);
  ConCatPathFileName(&include_test_path,tests_data_path,(string *)&builder);
  std::__cxx11::string::~string((string *)&builder);
  include_directories[0] = (tests_data_path->_M_dataplus)._M_p;
  include_directories[1] = include_test_path._M_dataplus._M_p;
  include_directories[2] = (char *)0x0;
  bVar1 = Parser::Parse(&parser,schemafile._M_dataplus._M_p,include_directories,(char *)0x0);
  TestEq<bool,bool>(bVar1,true,
                    "\'parser.Parse(schemafile.c_str(), include_directories)\' != \'true\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/json_test.cpp"
                    ,0x1d,"");
  builder.buf_.allocator_ = (Allocator *)0x0;
  builder.buf_.own_allocator_ = false;
  builder.buf_.initial_size_ = 0x400;
  builder.buf_.max_size_ = 0x7fffffff;
  builder.buf_.buffer_minalign_ = 8;
  builder.buf_.reserved_ = 0;
  builder.buf_.size_ = 0;
  parser.opts.output_default_scalars_in_json = true;
  builder.length_of_64_bit_region_ = 0;
  parser.opts.output_enum_identifiers = true;
  builder.nested = false;
  builder.finished = false;
  builder.buf_.buf_ = (uint8_t *)0x0;
  builder.buf_.cur_._0_6_ = 0;
  builder.buf_.cur_._6_2_ = 0;
  builder.buf_.scratch_._0_6_ = 0;
  builder._78_8_ = 0;
  builder.minalign_ = 1;
  builder.force_defaults_ = false;
  builder.dedup_vtables_ = true;
  builder.string_pool = (StringOffsetMap *)0x0;
  name = FlatBufferBuilderImpl<false>::CreateString<flatbuffers::Offset>(&builder,"default_enum");
  color_monster.fbb_ = &builder;
  color_monster.start_ = FlatBufferBuilderImpl<false>::StartTable(&builder);
  MyGame::Example::MonsterBuilder::add_name(&color_monster,name);
  root = MyGame::Example::MonsterBuilder::Finish(&color_monster);
  MyGame::Example::FinishMonsterBuffer(&builder,root);
  jsongen._M_dataplus._M_p = (pointer)&jsongen.field_2;
  jsongen._M_string_length = 0;
  jsongen.field_2._M_local_buf[0] = '\0';
  flatbuffer = FlatBufferBuilderImpl<false>::GetBufferPointer(&builder);
  pcVar2 = GenText(&parser,flatbuffer,&jsongen);
  TestEq<bool,bool>(true,pcVar2 == (char *)0x0,"\'nullptr\' != \'result\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/json_test.cpp"
                    ,0x28,"");
  lVar3 = std::__cxx11::string::find((char *)&jsongen,0x1980a3);
  TestEq<bool,bool>(lVar3 != -1,true,
                    "\'std::string::npos != jsongen.find(\"color: \\\"Blue\\\"\")\' != \'true\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/json_test.cpp"
                    ,0x2a,"");
  lVar3 = std::__cxx11::string::find((char *)&jsongen,0x1980f2);
  TestEq<bool,bool>(lVar3 != -1,true,
                    "\'std::string::npos != jsongen.find(\"testf: 3.14159\")\' != \'true\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/json_test.cpp"
                    ,0x2c,"");
  std::__cxx11::string::~string((string *)&jsongen);
  FlatBufferBuilderImpl<false>::~FlatBufferBuilderImpl(&builder);
  std::__cxx11::string::~string((string *)&include_test_path);
  Parser::~Parser(&parser);
  std::__cxx11::string::~string((string *)&schemafile);
  return;
}

Assistant:

void JsonDefaultTest(const std::string &tests_data_path) {
  // load FlatBuffer schema (.fbs) from disk
  std::string schemafile;
  TEST_EQ(flatbuffers::LoadFile((tests_data_path + "monster_test.fbs").c_str(),
                                false, &schemafile),
          true);
  // parse schema first, so we can use it to parse the data after
  flatbuffers::Parser parser;
  auto include_test_path =
      flatbuffers::ConCatPathFileName(tests_data_path, "include_test");
  const char *include_directories[] = { tests_data_path.c_str(),
                                        include_test_path.c_str(), nullptr };

  TEST_EQ(parser.Parse(schemafile.c_str(), include_directories), true);
  // create incomplete monster and store to json
  parser.opts.output_default_scalars_in_json = true;
  parser.opts.output_enum_identifiers = true;
  flatbuffers::FlatBufferBuilder builder;
  auto name = builder.CreateString("default_enum");
  MonsterBuilder color_monster(builder);
  color_monster.add_name(name);
  FinishMonsterBuffer(builder, color_monster.Finish());
  std::string jsongen;
  auto result = GenText(parser, builder.GetBufferPointer(), &jsongen);
  TEST_NULL(result);
  // default value of the "color" field is Blue
  TEST_EQ(std::string::npos != jsongen.find("color: \"Blue\""), true);
  // default value of the "testf" field is 3.14159
  TEST_EQ(std::string::npos != jsongen.find("testf: 3.14159"), true);
}